

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

bool __thiscall Minisat::Solver::check_invariants(Solver *this)

{
  uint uVar1;
  VarData *pVVar2;
  uint *puVar3;
  bool bVar4;
  uint uVar5;
  ostream *poVar6;
  long *plVar7;
  Lit old_trail_top;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  vec<unsigned_int> *pvVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  vec<Minisat::Watcher> *pvVar24;
  ulong *puVar25;
  long lVar26;
  bool bVar27;
  
  if ((this->trail).sz < 1) {
    bVar4 = true;
  }
  else {
    bVar4 = true;
    uVar15 = 0;
    do {
      pVVar2 = (this->vardata).data;
      iVar8 = (this->trail).data[uVar15].x >> 1;
      iVar9 = pVVar2[iVar8].level;
      if ((((long)iVar9 != 0) && (pVVar2[iVar8].reason == 0xffffffff)) &&
         (uVar15 != (uint)(this->trail_lim).data[(long)iVar9 + -1])) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"c trail literal ",0x10);
        uVar5 = (this->trail).data[uVar15].x;
        uVar19 = (int)uVar5 >> 1;
        uVar12 = ~uVar19;
        if ((uVar5 & 1) == 0) {
          uVar12 = uVar19 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cout,uVar12);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at level ",10);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," (pos: ",7);
        poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)uVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar6," has no proper reason clause",0x1c);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        bVar4 = false;
      }
      uVar15 = uVar15 + 1;
    } while ((long)uVar15 < (long)(this->trail).sz);
  }
  iVar9 = 0;
  do {
    pvVar13 = &this->clauses;
    if ((iVar9 != 0) && (pvVar13 = &this->learnts_core, iVar9 != 1)) {
      pvVar13 = &this->learnts_tier2 + (iVar9 != 2);
    }
    if (0 < pvVar13->sz) {
      lVar23 = 0;
      do {
        uVar5 = pvVar13->data[lVar23];
        puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        uVar15 = *(ulong *)(puVar3 + uVar5);
        if (((uint)uVar15 & 3) != 1) {
          puVar25 = (ulong *)(puVar3 + uVar5);
          if ((uVar15 & 0xfffffffc00000000) == 0x400000000) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"c there should not be unit clauses! [",0x25);
            poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
            if (0x3ffffffff < *puVar25) {
              uVar15 = 0;
              do {
                uVar5 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                uVar19 = (int)uVar5 >> 1;
                uVar12 = ~uVar19;
                if ((uVar5 & 1) == 0) {
                  uVar12 = uVar19 + 1;
                }
                std::ostream::operator<<((ostream *)poVar6,uVar12);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                uVar15 = uVar15 + 1;
              } while (uVar15 < *puVar25 >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
            std::ostream::put((char)poVar6);
            std::ostream::flush();
            bVar4 = false;
          }
          else if (uVar15 < 0xc00000000) {
            lVar26 = 0;
            do {
              iVar8 = *(int *)((long)puVar25 + lVar26 * 4 + 8);
              uVar10 = (long)iVar8 ^ 1;
              pvVar24 = (this->watches_bin).occs.data;
              uVar15 = (ulong)pvVar24[uVar10].sz;
              if ((long)uVar15 < 1) {
                iVar18 = 0;
              }
              else {
                iVar18 = 0;
                uVar14 = 1;
                do {
                  uVar12 = pvVar24[uVar10].data[uVar14 - 1].cref;
                  iVar18 = (uint)(uVar12 == uVar5) + iVar18;
                  if (uVar12 == uVar5) break;
                  bVar27 = uVar14 < uVar15;
                  uVar14 = uVar14 + 1;
                } while (bVar27);
              }
              if (iVar18 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"c could not find clause[",0x18);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
                if (0x3ffffffff < *puVar25) {
                  uVar15 = 0;
                  do {
                    uVar12 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                    uVar20 = (int)uVar12 >> 1;
                    uVar19 = ~uVar20;
                    if ((uVar12 & 1) == 0) {
                      uVar19 = uVar20 + 1;
                    }
                    std::ostream::operator<<((ostream *)poVar6,uVar19);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < *puVar25 >> 0x22);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," in watcher for lit [",0x15);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)lVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
                uVar12 = ~(iVar8 >> 1);
                if (((long)iVar8 & 1U) != 0) {
                  uVar12 = (iVar8 >> 1) + 1;
                }
                std::ostream::operator<<((ostream *)poVar6,uVar12);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," 1 time, but ",0xd);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," times",6);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
                bVar4 = false;
              }
              bVar27 = lVar26 == 0;
              lVar26 = lVar26 + 1;
            } while (bVar27);
          }
          else {
            lVar26 = 0;
            do {
              iVar8 = *(int *)((long)puVar25 + lVar26 * 4 + 8);
              uVar10 = (long)iVar8 ^ 1;
              pvVar24 = (this->watches).occs.data;
              uVar15 = (ulong)pvVar24[uVar10].sz;
              if ((long)uVar15 < 1) {
                iVar18 = 0;
              }
              else {
                iVar18 = 0;
                uVar14 = 1;
                do {
                  uVar12 = pvVar24[uVar10].data[uVar14 - 1].cref;
                  iVar18 = (uint)(uVar12 == uVar5) + iVar18;
                  if (uVar12 == uVar5) break;
                  bVar27 = uVar14 < uVar15;
                  uVar14 = uVar14 + 1;
                } while (bVar27);
              }
              if (iVar18 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"c could not find clause[",0x18);
                poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
                if (0x3ffffffff < *puVar25) {
                  uVar15 = 0;
                  do {
                    uVar12 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                    uVar20 = (int)uVar12 >> 1;
                    uVar19 = ~uVar20;
                    if ((uVar12 & 1) == 0) {
                      uVar19 = uVar20 + 1;
                    }
                    std::ostream::operator<<((ostream *)poVar6,uVar19);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                    uVar15 = uVar15 + 1;
                  } while (uVar15 < *puVar25 >> 0x22);
                }
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar6," in watcher for lit [",0x15);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,(int)lVar26);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
                uVar12 = ~(iVar8 >> 1);
                if (((long)iVar8 & 1U) != 0) {
                  uVar12 = (iVar8 >> 1) + 1;
                }
                std::ostream::operator<<((ostream *)poVar6,uVar12);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," 1 time, but ",0xd);
                poVar6 = (ostream *)std::ostream::operator<<((ostream *)poVar6,iVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar6," times",6);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                std::ostream::put((char)poVar6);
                std::ostream::flush();
                bVar4 = false;
              }
              bVar27 = lVar26 == 0;
              lVar26 = lVar26 + 1;
            } while (bVar27);
          }
        }
        lVar23 = lVar23 + 1;
      } while (lVar23 < pvVar13->sz);
    }
    iVar9 = iVar9 + 1;
    if (iVar9 == 4) {
      if (0 < (this->vardata).sz) {
        lVar23 = 0;
        do {
          uVar5 = (uint)lVar23;
          lVar26 = lVar23 + 1;
          iVar9 = 0;
          do {
            uVar12 = (uint)(iVar9 == 1) | uVar5 * 2;
            pvVar24 = (this->watches).occs.data;
            if (0 < pvVar24[uVar12].sz) {
              pvVar24 = pvVar24 + uVar12;
              uVar19 = (uint)lVar26;
              if (iVar9 == 1) {
                uVar19 = ~uVar5;
              }
              lVar16 = 1;
              lVar11 = 0;
              do {
                uVar20 = pvVar24->data[lVar11].cref;
                puVar25 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar20);
                lVar11 = lVar11 + 1;
                lVar17 = lVar16;
                if (lVar11 < pvVar24->sz) {
                  do {
                    if (pvVar24->data[lVar17].cref == uVar20) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"c found clause [",0x10);
                      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
                      if (0x3ffffffff < *puVar25) {
                        uVar15 = 0;
                        do {
                          uVar1 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                          uVar21 = (int)uVar1 >> 1;
                          uVar22 = ~uVar21;
                          if ((uVar1 & 1) == 0) {
                            uVar22 = uVar21 + 1;
                          }
                          std::ostream::operator<<((ostream *)poVar6,uVar22);
                          std::ostream::flush();
                          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                          uVar15 = uVar15 + 1;
                        } while (uVar15 < *puVar25 >> 0x22);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6," multiple times in watch lists of literal ",0x2a);
                      std::ostream::operator<<((ostream *)poVar6,uVar19);
                      std::ostream::flush();
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6)
                      ;
                      std::ostream::put((char)poVar6);
                      std::ostream::flush();
                    }
                    lVar17 = lVar17 + 1;
                  } while ((int)lVar17 < pvVar24->sz);
                }
                if ((*puVar25 & 3) == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found deleted clause [",0x18);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
                  if (0x3ffffffff < *puVar25) {
                    uVar15 = 0;
                    do {
                      uVar20 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                      uVar22 = (int)uVar20 >> 1;
                      uVar1 = ~uVar22;
                      if ((uVar20 & 1) == 0) {
                        uVar1 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar6,uVar1);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < *puVar25 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," in watch lists of literal ",0x1b);
                  std::ostream::operator<<((ostream *)poVar6,uVar19);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                }
                if (*puVar25 < 0xc00000000) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found binary or smaller clause [",0x22);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
                  if (0x3ffffffff < *puVar25) {
                    uVar15 = 0;
                    do {
                      uVar20 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                      uVar22 = (int)uVar20 >> 1;
                      uVar1 = ~uVar22;
                      if ((uVar20 & 1) == 0) {
                        uVar1 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar6,uVar1);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < *puVar25 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," in watch list of literal ",0x1a);
                  std::ostream::operator<<((ostream *)poVar6,uVar19);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                  bVar4 = false;
                }
                if (((uint)puVar25[1] != (uVar12 ^ 1)) &&
                   (*(uint *)((long)puVar25 + 0xc) != (uVar12 ^ 1))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c wrong literals for clause [",0x1d);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
                  if (0x3ffffffff < *puVar25) {
                    uVar15 = 0;
                    do {
                      uVar20 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                      uVar22 = (int)uVar20 >> 1;
                      uVar1 = ~uVar22;
                      if ((uVar20 & 1) == 0) {
                        uVar1 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar6,uVar1);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < *puVar25 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," are watched. Found in list for ",0x20);
                  std::ostream::operator<<((ostream *)poVar6,uVar19);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                  bVar4 = false;
                }
                lVar16 = lVar16 + 1;
              } while (lVar11 < pvVar24->sz);
            }
            pvVar24 = (this->watches_bin).occs.data;
            if (0 < pvVar24[uVar12].sz) {
              pvVar24 = pvVar24 + uVar12;
              uVar19 = (uint)lVar26;
              if (iVar9 == 1) {
                uVar19 = ~uVar5;
              }
              lVar16 = 1;
              lVar11 = 0;
              do {
                uVar20 = pvVar24->data[lVar11].cref;
                puVar25 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar20);
                lVar11 = lVar11 + 1;
                lVar17 = lVar16;
                if (lVar11 < pvVar24->sz) {
                  do {
                    if (pvVar24->data[lVar17].cref == uVar20) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"c found clause [",0x10);
                      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
                      if (0x3ffffffff < *puVar25) {
                        uVar15 = 0;
                        do {
                          uVar1 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                          uVar21 = (int)uVar1 >> 1;
                          uVar22 = ~uVar21;
                          if ((uVar1 & 1) == 0) {
                            uVar22 = uVar21 + 1;
                          }
                          std::ostream::operator<<((ostream *)poVar6,uVar22);
                          std::ostream::flush();
                          std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                          uVar15 = uVar15 + 1;
                        } while (uVar15 < *puVar25 >> 0x22);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar6," multiple times in watch lists of literal ",0x2a);
                      std::ostream::operator<<((ostream *)poVar6,uVar19);
                      std::ostream::flush();
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6)
                      ;
                      std::ostream::put((char)poVar6);
                      std::ostream::flush();
                    }
                    lVar17 = lVar17 + 1;
                  } while ((int)lVar17 < pvVar24->sz);
                }
                if ((*puVar25 & 3) == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found deleted clause [",0x18);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
                  if (0x3ffffffff < *puVar25) {
                    uVar15 = 0;
                    do {
                      uVar20 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                      uVar22 = (int)uVar20 >> 1;
                      uVar1 = ~uVar22;
                      if ((uVar20 & 1) == 0) {
                        uVar1 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar6,uVar1);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < *puVar25 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," in watch lists of literal ",0x1b);
                  std::ostream::operator<<((ostream *)poVar6,uVar19);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                }
                if ((*puVar25 & 0xfffffffc00000000) != 0x800000000) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found non-binary clause [",0x1b);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
                  if (0x3ffffffff < *puVar25) {
                    uVar15 = 0;
                    do {
                      uVar20 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                      uVar22 = (int)uVar20 >> 1;
                      uVar1 = ~uVar22;
                      if ((uVar20 & 1) == 0) {
                        uVar1 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar6,uVar1);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < *puVar25 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," in binary watch list of literal ",0x21);
                  std::ostream::operator<<((ostream *)poVar6,uVar19);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                  bVar4 = false;
                }
                if (((uint)puVar25[1] != (uVar12 ^ 1)) &&
                   (*(uint *)((long)puVar25 + 0xc) != (uVar12 ^ 1))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c wrong literals for clause [",0x1d);
                  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] ",2);
                  if (0x3ffffffff < *puVar25) {
                    uVar15 = 0;
                    do {
                      uVar20 = *(uint *)((long)puVar25 + uVar15 * 4 + 8);
                      uVar22 = (int)uVar20 >> 1;
                      uVar1 = ~uVar22;
                      if ((uVar20 & 1) == 0) {
                        uVar1 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar6,uVar1);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
                      uVar15 = uVar15 + 1;
                    } while (uVar15 < *puVar25 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar6," are watched. Found in list for ",0x20);
                  std::ostream::operator<<((ostream *)poVar6,uVar19);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
                  std::ostream::put((char)poVar6);
                  std::ostream::flush();
                  bVar4 = false;
                }
                lVar16 = lVar16 + 1;
              } while (lVar11 < pvVar24->sz);
            }
            bVar27 = iVar9 == 0;
            iVar9 = iVar9 + 1;
          } while (bVar27);
          if ((this->seen).data[lVar23] != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"c seen for variable ",0x14);
            poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar5);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6," is not 0, but ",0xf);
            plVar7 = (long *)std::ostream::operator<<
                                       ((ostream *)poVar6,(int)(this->seen).data[lVar23]);
            std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
            std::ostream::put((char)plVar7);
            std::ostream::flush();
            bVar4 = false;
          }
          lVar23 = lVar26;
        } while (lVar26 < (this->vardata).sz);
      }
      iVar9 = (this->old_trail).sz;
      if (0 < iVar9) {
        uVar5 = (this->old_trail).data[this->old_trail_qhead].x;
        uVar12 = (this->oldreasons).data[(int)uVar5 >> 1];
        puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        do {
          if (((uVar12 != 0xffffffff) &&
              ((*(ulong *)(puVar3 + uVar12) & 0xfffffffc00000000) != 0x800000000)) &&
             (puVar3[(ulong)uVar12 + 2] != uVar5)) {
            bVar4 = false;
          }
          iVar9 = iVar9 + -1;
        } while (iVar9 != 0);
      }
      return bVar4;
    }
  } while( true );
}

Assistant:

bool Solver::check_invariants()
{
    TRACE(printf("c check solver invariants\n");)

    bool pass = true;
    bool fatal_on_watch_removed = false;

    /* ensure that each assigned literal has a proper reason clause as well */
    for (int i = 0; i < trail.size(); ++i) {
        Var v = var(trail[i]);
        int l = level(v);
        if (!(l == 0 || reason(v) != CRef_Undef || trail_lim[l - 1] == i)) {
            std::cout << "c trail literal " << trail[i] << " at level " << l << " (pos: " << i
                      << " has no proper reason clause" << std::endl;
            pass = false;
        }
    }

    // check whether clause is in solver in the right watch lists
    for (int p = 0; p < 4; ++p) {

        const vec<CRef> &clause_list = (p == 0 ? clauses : (p == 1 ? learnts_core : (p == 2 ? learnts_tier2 : learnts_local)));
        for (int i = 0; i < clause_list.size(); ++i) {
            const CRef cr = clause_list[i];
            const Clause &c = ca[cr];
            if (c.mark() == 1) {
                continue;
            }

            if (c.size() == 1) {
                std::cout << "c there should not be unit clauses! [" << cr << "]" << c << std::endl;
                pass = false;
            } else {
                if (c.size() > 2) {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                } else {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches_bin[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                }
            }
        }
    }

    for (Var v = 0; v < nVars(); ++v) {
        for (int p = 0; p < 2; ++p) {
            const Lit l = mkLit(v, p == 1);
            vec<Watcher> &ws = watches[l];
            for (int j = 0; j < ws.size(); ++j) {
                CRef wcr = ws[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws.size(); ++k) {
                    CRef inner_cr = ws[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() <= 2) {
                    std::cout << "c found binary or smaller clause [" << wcr << "]" << c << " in watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
            vec<Watcher> &ws_bin = watches_bin[l];
            for (int j = 0; j < ws_bin.size(); ++j) {
                CRef wcr = ws_bin[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws_bin.size(); ++k) {
                    CRef inner_cr = ws_bin[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() != 2) {
                    std::cout << "c found non-binary clause [" << wcr << "]" << c << " in binary watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
        }
        if (seen[v] != 0) {
            std::cout << "c seen for variable " << v << " is not 0, but " << (int)seen[v] << std::endl;
            pass = false;
        }
    }

    for (int i = 0; i < old_trail.size(); ++i) {
        const Lit old_trail_top = old_trail[old_trail_qhead];
        const CRef old_reason = oldreasons[var(old_trail_top)];
        if (old_reason == CRef_Undef) continue;
        const Clause &c = ca[old_reason];
        assert((c.size() == 2 || c[0] == old_trail_top) && "assert literal has to be at first position");
        if (!(c.size() == 2 || c[0] == old_trail_top)) pass = false;
    }


    assert(pass && "some solver invariant check failed");
    return pass;
}